

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::GetColumnsStringValue_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ParsedExpression *expr)

{
  ColumnRefExpression *this_00;
  string *psVar1;
  
  if (this[8] == (duckdb)0xcb) {
    this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>((BaseExpression *)this);
    psVar1 = ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  else {
    (**(code **)(*(long *)this + 0x40))(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string GetColumnsStringValue(ParsedExpression &expr) {
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		return colref.GetColumnName();
	} else {
		return expr.ToString();
	}
}